

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

void Write(string *output,vector<TCacheReq,_std::allocator<TCacheReq>_> *reqs)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pTVar4;
  TCacheReq *req;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TCacheReq,_std::allocator<TCacheReq>_> *__range1;
  ostream local_218 [8];
  ofstream out;
  vector<TCacheReq,_std::allocator<TCacheReq>_> *reqs_local;
  string *output_local;
  
  std::ofstream::ofstream(local_218,output,0x10);
  sVar2 = std::vector<TCacheReq,_std::allocator<TCacheReq>_>::size(reqs);
  poVar3 = (ostream *)std::ostream::operator<<(local_218,sVar2);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<TCacheReq,_std::allocator<TCacheReq>_>::begin(reqs);
  req = (TCacheReq *)std::vector<TCacheReq,_std::allocator<TCacheReq>_>::end(reqs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_TCacheReq_*,_std::vector<TCacheReq,_std::allocator<TCacheReq>_>_>
                                *)&req);
    if (!bVar1) break;
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_TCacheReq_*,_std::vector<TCacheReq,_std::allocator<TCacheReq>_>_>
             ::operator*(&__end1);
    poVar3 = (ostream *)std::ostream::operator<<(local_218,pTVar4->ServerId);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pTVar4->VideoId);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_TCacheReq_*,_std::vector<TCacheReq,_std::allocator<TCacheReq>_>_>::
    operator++(&__end1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Write(const std::string& output, const std::vector<TCacheReq>& reqs) {
    std::ofstream out(output);
    out << reqs.size() << std::endl;
    for (const auto& req : reqs) {
        out << req.ServerId << " " << req.VideoId << std::endl;
    }
    out.close();
}